

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<void_*>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<void_*>_>::operator=
          (ExceptionOr<kj::Promise<void_*>_> *this,ExceptionOr<kj::Promise<void_*>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Promise<void_*>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;